

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::FeatureVectorizer::SerializeWithCachedSizes
          (FeatureVectorizer *this,CodedOutputStream *output)

{
  int iVar1;
  Type *value;
  int index;
  
  iVar1 = (this->inputlist_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar1 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureVectorizer_InputColumn>::TypeHandler>
                      (&(this->inputlist_).super_RepeatedPtrFieldBase,index);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
  }
  return;
}

Assistant:

void FeatureVectorizer::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.FeatureVectorizer)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.FeatureVectorizer.InputColumn inputList = 1;
  for (unsigned int i = 0, n = this->inputlist_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->inputlist(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.FeatureVectorizer)
}